

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O1

void __thiscall
wasm::StringLowering::replaceInstructions(wasm::Module*)::Replacer::visitStringEncode(wasm::
StringEncode__(void *this,StringEncode *curr)

{
  IString target;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_68;
  Expression *pEStack_60;
  Expression *local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  Builder local_38;
  Builder builder;
  
  local_38.wasm = *(Module **)((long)this + 0x128);
  if (curr->op == StringEncodeWTF16Array) {
    target.str = ((IString *)(*(long *)((long)this + 0x130) + 0x130))->str;
    local_68 = curr->str;
    pEStack_60 = curr->array;
    local_58 = curr->start;
    __l._M_len = 3;
    __l._M_array = &local_68;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_50,__l,(allocator_type *)((long)&builder.wasm + 7));
    expression = Builder::makeCall(&local_38,(Name)target.str,&local_50,(Type)0x2,false);
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::replaceCurrent
              ((Walker<Replacer,_wasm::Visitor<Replacer,_void>_> *)((long)this + 0x58),
               (Expression *)expression);
    if (local_50.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  handle_unreachable("TODO: all of string.encode*",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/StringLowering.cpp"
                     ,0x1c6);
}

Assistant:

void visitStringEncode(StringEncode* curr) {
        Builder builder(*getModule());
        switch (curr->op) {
          case StringEncodeWTF16Array:
            replaceCurrent(
              builder.makeCall(lowering.intoCharCodeArrayImport,
                               {curr->str, curr->array, curr->start},
                               Type::i32));
            return;
          default:
            WASM_UNREACHABLE("TODO: all of string.encode*");
        }
      }